

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

QString * __thiscall
QTextHtmlExporter::findUrlForImage
          (QString *__return_storage_ptr__,QTextHtmlExporter *this,QTextDocument *doc,
          qint64 cacheKey,bool isPixmap)

{
  _Base_ptr *this_00;
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  QTextDocument *doc_00;
  long lVar5;
  qint64 qVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  if (doc == (QTextDocument *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    doc_00 = QtPrivate::qobject_cast_helper<QTextDocument*,QObject>
                       (*(QObject **)(*(long *)&doc->field_0x8 + 0x10));
    if (doc_00 == (QTextDocument *)0x0) {
      lVar1 = *(long *)&doc->field_0x8;
      lVar5 = *(long *)(lVar1 + 0x188);
      if (lVar5 == 0) {
        p_Var7 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var7 = *(_Rb_tree_node_base **)(lVar5 + 0x20);
      }
      while( true ) {
        p_Var8 = (_Rb_tree_node_base *)(lVar5 + 0x10);
        if (lVar5 == 0) {
          p_Var8 = (_Rb_tree_node_base *)0x0;
        }
        if (p_Var7 == p_Var8) break;
        this_00 = &p_Var7[1]._M_parent;
        iVar4 = ::QVariant::typeId((QVariant *)this_00);
        if (iVar4 == 0x1006 && !isPixmap) {
          qvariant_cast<QImage>((QImage *)&local_78,(QVariant *)this_00);
          qVar6 = QImage::cacheKey((QImage *)&local_78);
          QImage::~QImage((QImage *)&local_78);
          if (qVar6 == cacheKey) break;
        }
        iVar4 = ::QVariant::typeId((QVariant *)this_00);
        if (iVar4 == 0x1001 && isPixmap) {
          qvariant_cast<QPixmap>((QPixmap *)&local_78,(QVariant *)this_00);
          qVar6 = QPixmap::cacheKey((QPixmap *)&local_78);
          QPixmap::~QPixmap((QPixmap *)&local_78);
          if (qVar6 == cacheKey) break;
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        lVar5 = *(long *)(lVar1 + 0x188);
      }
      p_Var8 = (_Rb_tree_node_base *)(*(long *)(lVar1 + 0x188) + 0x10);
      if (*(long *)(lVar1 + 0x188) == 0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var7 == p_Var8) {
        qVar9 = local_58.size;
        local_98 = local_58.d._0_4_;
        uStack_94 = local_58.d._4_4_;
        uStack_90 = local_58.ptr._0_4_;
        uStack_8c = local_58.ptr._4_4_;
      }
      else {
        QUrl::toString(&local_78,p_Var7 + 1,0);
        qVar9 = local_78.size;
        pcVar3 = local_78.ptr;
        pDVar2 = local_78.d;
        local_78.d = local_58.d;
        local_78.ptr = local_58.ptr;
        local_78.size = local_58.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        local_98 = SUB84(pDVar2,0);
        uStack_94 = (undefined4)((ulong)pDVar2 >> 0x20);
        uStack_90 = SUB84(pcVar3,0);
        uStack_8c = (undefined4)((ulong)pcVar3 >> 0x20);
      }
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      *(undefined4 *)&(__return_storage_ptr__->d).d = local_98;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uStack_94;
      *(undefined4 *)&(__return_storage_ptr__->d).ptr = uStack_90;
      *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_8c;
      local_58.size = 0;
      (__return_storage_ptr__->d).size = qVar9;
    }
    else {
      findUrlForImage(__return_storage_ptr__,this,doc_00,cacheKey,isPixmap);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextHtmlExporter::findUrlForImage(const QTextDocument *doc, qint64 cacheKey, bool isPixmap)
{
    QString url;
    if (!doc)
        return url;

    if (QTextDocument *parent = qobject_cast<QTextDocument *>(doc->parent()))
        return findUrlForImage(parent, cacheKey, isPixmap);

    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(doc);
    Q_ASSERT(priv != nullptr);

    QMap<QUrl, QVariant>::const_iterator it = priv->cachedResources.constBegin();
    for (; it != priv->cachedResources.constEnd(); ++it) {

        const QVariant &v = it.value();
        if (v.userType() == QMetaType::QImage && !isPixmap) {
            if (qvariant_cast<QImage>(v).cacheKey() == cacheKey)
                break;
        }

        if (v.userType() == QMetaType::QPixmap && isPixmap) {
            if (qvariant_cast<QPixmap>(v).cacheKey() == cacheKey)
                break;
        }
    }

    if (it != priv->cachedResources.constEnd())
        url = it.key().toString();

    return url;
}